

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::write_decimal<unsigned_long_long>
          (basic_writer<fmt::v5::output_range<char_*,_char>_> *this,unsigned_long_long value)

{
  iterator __dest;
  bool bVar1;
  long lVar2;
  undefined1 *puVar3;
  byte bVar4;
  uint uVar5;
  ptrdiff_t _Num;
  ulong __n;
  ulong uVar6;
  undefined1 auStack_38 [32];
  
  lVar2 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar5 = ((uint)lVar2 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  __n = (ulong)((uVar5 - (value < (ulong)(&internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64)
                                         [uVar5])) + 1);
  puVar3 = auStack_38 + __n;
  uVar6 = value;
  if (99 < value) {
    do {
      value = uVar6 / 100;
      *(undefined2 *)(puVar3 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar6 + (int)value * -100) * 2)
      ;
      puVar3 = puVar3 + -2;
      bVar1 = 9999 < uVar6;
      uVar6 = value;
    } while (bVar1);
  }
  __dest = this->out_;
  if (value < 10) {
    bVar4 = (byte)value | 0x30;
    lVar2 = -1;
  }
  else {
    puVar3[-1] = internal::basic_data<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[value * 2 & 0x1fffffffe];
    lVar2 = -2;
  }
  puVar3[lVar2] = bVar4;
  if (__n != 0) {
    memcpy(__dest,auStack_38,__n);
  }
  this->out_ = __dest + __n;
  return;
}

Assistant:

inline int count_digits(uint64_t n) {
  // Based on http://graphics.stanford.edu/~seander/bithacks.html#IntegerLog10
  // and the benchmark https://github.com/localvoid/cxx-benchmark-count-digits.
  int t = (64 - FMT_BUILTIN_CLZLL(n | 1)) * 1233 >> 12;
  return t - (n < data::ZERO_OR_POWERS_OF_10_64[t]) + 1;
}